

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeitem.cpp
# Opt level: O2

void __thiscall
TreeItem::TreeItem(TreeItem *this,UINT32 offset,UINT8 type,UINT8 subtype,CBString *name,
                  CBString *text,CBString *info,UByteArray *header,UByteArray *body,UByteArray *tail
                  ,bool fixed,bool compressed,TreeItem *parent)

{
  (this->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this;
  (this->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this;
  (this->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl._M_node.
  _M_size = 0;
  this->itemOffset = offset;
  this->itemAction = '2';
  this->itemType = type;
  this->itemSubtype = subtype;
  this->itemMarking = '\0';
  Bstrlib::CBString::CBString(&this->itemName,name);
  Bstrlib::CBString::CBString(&this->itemText,text);
  Bstrlib::CBString::CBString(&this->itemInfo,info);
  std::__cxx11::string::string((string *)&this->itemHeader,(string *)header);
  std::__cxx11::string::string((string *)&this->itemBody,(string *)body);
  std::__cxx11::string::string((string *)&this->itemTail,(string *)tail);
  this->itemFixed = fixed;
  this->itemCompressed = compressed;
  (this->itemParsingData).d._M_dataplus._M_p = (pointer)&(this->itemParsingData).d.field_2;
  (this->itemParsingData).d._M_string_length = 0;
  (this->itemParsingData).d.field_2._M_local_buf[0] = '\0';
  (this->itemUncompressedData).d._M_dataplus._M_p = (pointer)&(this->itemUncompressedData).d.field_2
  ;
  (this->itemUncompressedData).d._M_string_length = 0;
  (this->itemUncompressedData).d.field_2._M_local_buf[0] = '\0';
  this->parentItem = parent;
  return;
}

Assistant:

TreeItem::TreeItem(const UINT32 offset, const UINT8 type, const UINT8 subtype,
                   const UString & name, const UString & text, const UString & info,
                   const UByteArray & header, const UByteArray & body, const UByteArray & tail,
                   const bool fixed, const bool compressed,
                   TreeItem *parent) :
itemOffset(offset),
itemAction(Actions::NoAction),
itemType(type),
itemSubtype(subtype),
itemMarking(0),
itemName(name),
itemText(text),
itemInfo(info),
itemHeader(header),
itemBody(body),
itemTail(tail),
itemFixed(fixed),
itemCompressed(compressed),
parentItem(parent)
{
}